

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3RowSetNext(RowSet *p,i64 *pRowid)

{
  RowSetEntry *pRVar1;
  undefined8 *in_RSI;
  long in_RDI;
  RowSetEntry *in_stack_00000140;
  undefined4 local_4;
  
  if ((*(ushort *)(in_RDI + 0x32) & 2) == 0) {
    if ((*(ushort *)(in_RDI + 0x32) & 1) == 0) {
      pRVar1 = rowSetEntrySort(in_stack_00000140);
      *(RowSetEntry **)(in_RDI + 0x10) = pRVar1;
    }
    *(ushort *)(in_RDI + 0x32) = *(ushort *)(in_RDI + 0x32) | 3;
  }
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_4 = 0;
  }
  else {
    *in_RSI = **(undefined8 **)(in_RDI + 0x10);
    *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(*(long *)(in_RDI + 0x10) + 8);
    if (*(long *)(in_RDI + 0x10) == 0) {
      sqlite3RowSetClear(pRowid);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3RowSetNext(RowSet *p, i64 *pRowid){
  assert( p!=0 );
  assert( p->pForest==0 );  /* Cannot be used with sqlite3RowSetText() */

  /* Merge the forest into a single sorted list on first call */
  if( (p->rsFlags & ROWSET_NEXT)==0 ){  /*OPTIMIZATION-IF-FALSE*/
    if( (p->rsFlags & ROWSET_SORTED)==0 ){  /*OPTIMIZATION-IF-FALSE*/
      p->pEntry = rowSetEntrySort(p->pEntry);
    }
    p->rsFlags |= ROWSET_SORTED|ROWSET_NEXT;
  }

  /* Return the next entry on the list */
  if( p->pEntry ){
    *pRowid = p->pEntry->v;
    p->pEntry = p->pEntry->pRight;
    if( p->pEntry==0 ){ /*OPTIMIZATION-IF-TRUE*/
      /* Free memory immediately, rather than waiting on sqlite3_finalize() */
      sqlite3RowSetClear(p);
    }
    return 1;
  }else{
    return 0;
  }
}